

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::LinearExprHandler>
          (void *param_1,uint param_2)

{
  int iVar1;
  double coef;
  int var_index;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  TextReader<fmt::Locale> *this;
  
  this = (TextReader<fmt::Locale> *)param_1;
  for (local_18 = 0; local_18 < (int)param_2; local_18 = local_18 + 1) {
    iVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadUInt
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *)this,param_2)
    ;
    TextReader<fmt::Locale>::ReadDouble
              ((TextReader<fmt::Locale> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    TextReader<fmt::Locale>::ReadTillEndOfLine(this);
    NLHandler<mp::NullNLHandler<Expr>,_Expr>::LinearExprHandler::AddTerm
              ((LinearExprHandler *)param_1,in_stack_ffffffffffffffcc,5.42975674451301e-318);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}